

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
          (ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *this,size_t newSize)

{
  size_t sVar1;
  size_t newSize_local;
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *this_local;
  
  if (this->numActive < newSize) {
    reserve(this,newSize);
    while (this->numActive < newSize) {
      sVar1 = this->numActive;
      this->numActive = sVar1 + 1;
      pool_ptr<soul::AST::Constant>::pool_ptr(this->items + sVar1);
    }
  }
  else {
    shrink(this,newSize);
  }
  return;
}

Assistant:

void resize (size_t newSize)
    {
        if (newSize > numActive)
        {
            reserve (newSize);

            while (numActive < newSize)
                new (items + numActive++) Item (Item());
        }
        else
        {
            shrink (newSize);
        }
    }